

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::Builder(Builder *this,VersionSet *vset,Version *base)

{
  allocator_type *this_00;
  void *pvVar1;
  allocator_type *__comp;
  undefined8 in_RDX;
  undefined8 in_RSI;
  allocator_type *in_RDI;
  int level;
  BySmallestKey cmp;
  int local_24;
  
  *(undefined8 *)in_RDI = in_RSI;
  *(undefined8 *)(in_RDI + 8) = in_RDX;
  this_00 = in_RDI + 0x10;
  __comp = in_RDI + 0x198;
  do {
    LevelState::LevelState((LevelState *)0x12e2f5);
    this_00 = this_00 + 0x38;
  } while (this_00 != __comp);
  Version::Ref(*(Version **)(in_RDI + 8));
  for (local_24 = 0; local_24 < 7; local_24 = local_24 + 1) {
    pvVar1 = operator_new(0x30);
    std::allocator<leveldb::FileMetaData_*>::allocator
              ((allocator<leveldb::FileMetaData_*> *)0x12e354);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::set((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
           *)this_00,(BySmallestKey *)__comp,in_RDI);
    *(void **)(in_RDI + (long)local_24 * 0x38 + 0x40) = pvVar1;
    std::allocator<leveldb::FileMetaData_*>::~allocator
              ((allocator<leveldb::FileMetaData_*> *)0x12e390);
  }
  return;
}

Assistant:

Builder(VersionSet* vset, Version* base) : vset_(vset), base_(base) {
    base_->Ref();
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      levels_[level].added_files = new FileSet(cmp);
    }
  }